

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDirPrivate::setPath(QDirPrivate *this,QString *path)

{
  bool bVar1;
  __off_t __length;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (path->d).d;
  local_68.ptr = (path->d).ptr;
  local_68.size = (path->d).size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar1 = QString::endsWith((QString *)&local_68,(QChar)0x2f,CaseSensitive);
  if ((bVar1) && (1 < (ulong)local_68.size)) {
    QString::truncate((QString *)&local_68,(char *)(local_68.size - 1),__length);
  }
  QFileSystemEntry::QFileSystemEntry(&local_50,&local_68);
  QFileSystemEntry::operator=(&this->dirEntry,&local_50);
  QFileSystemEntry::~QFileSystemEntry(&local_50);
  clearCache(this,IncludingMetaData);
  QFileSystemEntry::QFileSystemEntry(&local_50);
  QFileSystemEntry::operator=(&(this->fileCache).absoluteDirEntry,&local_50);
  QFileSystemEntry::~QFileSystemEntry(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::setPath(const QString &path)
{
    QString p = QDir::fromNativeSeparators(path);
    if (p.endsWith(u'/')
            && p.size() > 1
#if defined(Q_OS_WIN)
        && (!(p.length() == 3 && p.at(1).unicode() == ':' && p.at(0).isLetter()))
#endif
    ) {
            p.truncate(p.size() - 1);
    }
    dirEntry = QFileSystemEntry(p, QFileSystemEntry::FromInternalPath());
    clearCache(IncludingMetaData);
    fileCache.absoluteDirEntry = QFileSystemEntry();
}